

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O0

void Abc_NodeShowBddOne(DdManager *dd,DdNode *bFunc)

{
  FILE *__stream;
  FILE *pFile;
  char *FileNameDot;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  FileNameDot = (char *)bFunc;
  bFunc_local = &dd->sentinel;
  __stream = fopen("temp.dot","w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n","temp.dot");
  }
  else {
    Cudd_DumpDot((DdManager *)bFunc_local,1,(DdNode **)&FileNameDot,(char **)0x0,(char **)0x0,
                 (FILE *)__stream);
    fclose(__stream);
    Abc_ShowFile("temp.dot");
  }
  return;
}

Assistant:

void Abc_NodeShowBddOne( DdManager * dd, DdNode * bFunc )
{
    char * FileNameDot = "temp.dot";
    FILE * pFile;
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    Cudd_DumpDot( dd, 1, (DdNode **)&bFunc, NULL, NULL, pFile );
    fclose( pFile );
    Abc_ShowFile( FileNameDot );
}